

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

ArrayIndex __thiscall Json::Value::size(Value *this)

{
  byte bVar1;
  bool bVar2;
  reference this_00;
  char *pcVar3;
  size_type sVar4;
  int __c;
  iterator *__it;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *in_RDI;
  const_iterator itLast;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffffc8;
  iterator local_20;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_18 [2];
  ArrayIndex local_4;
  
  bVar1 = *(byte *)&in_RDI[1]._M_node;
  if (bVar1 < 6) {
    local_4 = 0;
  }
  else if (bVar1 == 6) {
    bVar2 = std::
            map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::empty((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                     *)0x12e123);
    if (bVar2) {
      local_4 = 0;
    }
    else {
      local_20._M_node =
           (_Base_ptr)
           std::
           map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           ::end(in_stack_ffffffffffffffc8);
      __it = &local_20;
      std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
      _Rb_tree_const_iterator(local_18,__it);
      std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator--
                (in_RDI);
      this_00 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
                operator*(in_RDI);
      pcVar3 = CZString::index(&this_00->first,(char *)__it,__c);
      local_4 = (int)pcVar3 + 1;
    }
  }
  else if (bVar1 == 7) {
    sVar4 = std::
            map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                    *)0x12e184);
    local_4 = (ArrayIndex)sVar4;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ArrayIndex Value::size() const {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
  case stringValue:
    return 0;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue: // size of the array is highest index + 1
    if (!value_.map_->empty()) {
      ObjectValues::const_iterator itLast = value_.map_->end();
      --itLast;
      return (*itLast).first.index() + 1;
    }
    return 0;
  case objectValue:
    return ArrayIndex(value_.map_->size());
#else
  case arrayValue:
    return Int(value_.array_->size());
  case objectValue:
    return Int(value_.map_->size());
#endif
  }
  JSON_ASSERT_UNREACHABLE;
  return 0; // unreachable;
}